

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive_generalized_cepstral_analysis.cc
# Opt level: O3

void __thiscall
sptk::AdaptiveGeneralizedCepstralAnalysis::AdaptiveGeneralizedCepstralAnalysis
          (AdaptiveGeneralizedCepstralAnalysis *this,int num_order,int num_stage,double min_epsilon,
          double momentum,double forgetting_factor,double step_size_factor,bool gain_flag)

{
  this->_vptr_AdaptiveGeneralizedCepstralAnalysis =
       (_func_int **)&PTR__AdaptiveGeneralizedCepstralAnalysis_00113cc0;
  this->num_stage_ = num_stage;
  this->min_epsilon_ = min_epsilon;
  this->momentum_ = momentum;
  this->forgetting_factor_ = forgetting_factor;
  this->step_size_factor_ = step_size_factor;
  this->gain_flag_ = gain_flag;
  GeneralizedCepstrumInverseGainNormalization::GeneralizedCepstrumInverseGainNormalization
            (&this->generalized_cepstrum_inverse_gain_normalization_,num_order,
             -1.0 / (double)num_stage);
  this->is_valid_ = true;
  if ((((((this->num_stage_ < 1) || (this->min_epsilon_ <= 0.0)) || (this->momentum_ < 0.0)) ||
       ((1.0 <= this->momentum_ || (this->forgetting_factor_ < 0.0)))) ||
      ((1.0 <= this->forgetting_factor_ ||
       ((this->step_size_factor_ <= 0.0 || (1.0 <= this->step_size_factor_)))))) ||
     ((this->generalized_cepstrum_inverse_gain_normalization_).is_valid_ == false)) {
    this->is_valid_ = false;
  }
  return;
}

Assistant:

AdaptiveGeneralizedCepstralAnalysis::AdaptiveGeneralizedCepstralAnalysis(
    int num_order, int num_stage, double min_epsilon, double momentum,
    double forgetting_factor, double step_size_factor, bool gain_flag)
    : num_stage_(num_stage),
      min_epsilon_(min_epsilon),
      momentum_(momentum),
      forgetting_factor_(forgetting_factor),
      step_size_factor_(step_size_factor),
      gain_flag_(gain_flag),
      generalized_cepstrum_inverse_gain_normalization_(num_order,
                                                       -1.0 / num_stage_),
      is_valid_(true) {
  if (num_stage_ <= 0 || min_epsilon_ <= 0.0 || momentum_ < 0.0 ||
      1.0 <= momentum_ || forgetting_factor_ < 0.0 ||
      1.0 <= forgetting_factor_ || step_size_factor_ <= 0.0 ||
      1.0 <= step_size_factor_ ||
      !generalized_cepstrum_inverse_gain_normalization_.IsValid()) {
    is_valid_ = false;
    return;
  }
}